

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O3

void __thiscall bgui::ImageWindow::onMousePressed(ImageWindow *this,Button b,int x,int y,int state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImageAdapterBase *pIVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int h;
  int w;
  int local_7c;
  double local_78;
  undefined8 uStack_70;
  int local_68;
  undefined4 uStack_64;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  switch(b) {
  case button1:
    uVar10 = x + this->imx;
    this->xp = uVar10;
    this->yp = this->imy + y;
    if (((((state & 0x20U) == 0) || ((int)uVar10 < 0 || this->adapt == (ImageAdapterBase *)0x0)) ||
        (iVar7 = (*this->adapt->_vptr_ImageAdapterBase[0xb])(),
        CONCAT44(extraout_var,iVar7) <= (long)(ulong)uVar10)) ||
       ((iVar7 = this->yp, (long)iVar7 < 0 ||
        (iVar8 = (*this->adapt->_vptr_ImageAdapterBase[0xc])(),
        CONCAT44(extraout_var_00,iVar8) <= (long)iVar7)))) {
LAB_0010d9a7:
      updateInfo(this);
      return;
    }
    this->showinfo = false;
    (*this->adapt->_vptr_ImageAdapterBase[10])(&local_68,this->adapt,(long)this->xp,(long)this->yp);
    pcVar6 = (char *)CONCAT44(uStack_64,local_68);
    iVar7 = BaseWindow::getTextHeight(&this->super_BaseWindow);
    BaseWindow::setInfoLine(&this->super_BaseWindow,pcVar6,iVar7 < y,true);
    goto LAB_0010da54;
  case button3:
    uVar10 = x + this->imx;
    this->xp = uVar10;
    this->yp = this->imy + y;
    if ((int)uVar10 < 0 || this->adapt == (ImageAdapterBase *)0x0) {
      return;
    }
    iVar7 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
    if (CONCAT44(extraout_var_01,iVar7) <= (long)(ulong)uVar10) {
      return;
    }
    iVar7 = this->yp;
    if ((long)iVar7 < 0) {
      return;
    }
    iVar8 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
    if (CONCAT44(extraout_var_02,iVar8) <= (long)iVar7) {
      return;
    }
    this->showinfo = false;
    (*this->adapt->_vptr_ImageAdapterBase[10])(&local_68,this->adapt,(long)this->xp,(long)this->yp);
    pcVar6 = (char *)CONCAT44(uStack_64,local_68);
    iVar7 = BaseWindow::getTextHeight(&this->super_BaseWindow);
    BaseWindow::setInfoLine(&this->super_BaseWindow,pcVar6,iVar7 < y,true);
LAB_0010da54:
    if ((undefined1 *)CONCAT44(uStack_64,local_68) != local_58) {
      operator_delete((undefined1 *)CONCAT44(uStack_64,local_68));
    }
    break;
  case button4:
    BaseWindow::setInfoLine(&this->super_BaseWindow,"",true,true);
    if (this->adapt != (ImageAdapterBase *)0x0) {
      dVar12 = this->adapt->scale;
      local_38._8_8_ = (double)y;
      local_38._0_8_ = (double)x;
      uVar1 = this->imx;
      uVar3 = this->imy;
      auVar16._0_8_ = (double)(uVar1 + x);
      auVar16._8_8_ = (double)(uVar3 + y);
      auVar14._8_8_ = dVar12;
      auVar14._0_8_ = dVar12;
      local_48 = divpd(auVar16,auVar14);
      dVar12 = log(1.0 / dVar12);
      dVar12 = floor(dVar12 / 0.6931471805599453);
      dVar12 = exp2(dVar12);
      dVar12 = 1.0 / dVar12;
      uVar11 = -(ulong)(this->adapt->scale == dVar12);
      dVar12 = (double)(~uVar11 & (ulong)dVar12 | (ulong)(dVar12 + dVar12) & uVar11);
      this->adapt->scale = dVar12;
      this->imx = (int)(long)(dVar12 * (double)local_48._0_8_ - (double)local_38._0_8_);
      this->imy = (int)(long)(dVar12 * (double)local_48._8_8_ - (double)local_38._8_8_);
      redrawImage(this,true);
      goto LAB_0010d9a7;
    }
    break;
  case button5:
    pIVar5 = this->adapt;
    if (pIVar5 != (ImageAdapterBase *)0x0) {
      local_78 = pIVar5->scale;
      uStack_70 = 0;
      uVar2 = this->imx;
      uVar4 = this->imy;
      local_48._4_4_ = y;
      local_48._0_4_ = x;
      local_48._8_8_ = 0;
      auVar15._0_8_ = (double)(uVar2 + x);
      auVar15._8_8_ = (double)(uVar4 + y);
      auVar13._8_8_ = local_78;
      auVar13._0_8_ = local_78;
      local_38 = divpd(auVar15,auVar13);
      pIVar5->scale = 1.0;
      iVar7 = (*pIVar5->_vptr_ImageAdapterBase[0xb])();
      iVar8 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
      BaseWindow::getSize(&this->super_BaseWindow,&local_68,&local_7c);
      dVar12 = log(1.0 / local_78);
      dVar12 = floor(dVar12 / 0.6931471805599453 + 1e-06);
      dVar12 = exp2(dVar12);
      dVar12 = (1.0 / dVar12) * 0.5;
      pIVar5 = this->adapt;
      pIVar5->scale = dVar12;
      if (dVar12 < 1.0) {
        uStack_70 = 0;
        local_78 = dVar12;
        iVar9 = (*pIVar5->_vptr_ImageAdapterBase[0xb])();
        if ((CONCAT44(extraout_var_05,iVar9) < (long)local_68) &&
           (iVar9 = (*this->adapt->_vptr_ImageAdapterBase[0xc])(),
           CONCAT44(extraout_var_06,iVar9) < (long)local_7c)) {
          local_78 = (double)local_68 / (double)CONCAT44(extraout_var_03,iVar7);
          pIVar5 = this->adapt;
          uStack_70 = 0;
          pIVar5->scale = local_78;
          iVar7 = (*pIVar5->_vptr_ImageAdapterBase[0xc])();
          if ((long)local_7c < CONCAT44(extraout_var_07,iVar7)) {
            local_78 = (double)local_7c / (double)CONCAT44(extraout_var_04,iVar8);
            uStack_70 = 0;
            this->adapt->scale = local_78;
          }
        }
        dVar12 = local_78;
        if (1.0 < local_78) {
          this->adapt->scale = 1.0;
          dVar12 = 1.0;
        }
      }
      this->imx = (int)(long)((double)local_38._0_8_ * dVar12 - (double)local_48._0_4_);
      this->imy = (int)(long)((double)local_38._8_8_ * dVar12 - (double)local_48._4_4_);
      redrawImage(this,true);
      updateInfo(this);
    }
  }
  return;
}

Assistant:

void ImageWindow::onMousePressed(Button b, int x, int y, int state)
{
  switch (b)
  {
    case button1:
      // store for panning

      xp=x+imx;
      yp=y+imy;

      if ((state & shiftmask) != 0 && adapt != 0 && xp >= 0 &&
          xp < adapt->getWidth() && yp >= 0 && yp < adapt->getHeight())
      {
        showinfo=false;
        setInfoLine(adapt->getDescriptionOfPixel(xp, yp).c_str(), y > getTextHeight());
      }
      else
      {
        updateInfo();
      }

      break;

    case button3:
      xp=x+imx;
      yp=y+imy;

      if (adapt != 0 && xp >= 0 && xp < adapt->getWidth() && yp >= 0 &&
          yp < adapt->getHeight())
      {
        showinfo=false;
        setInfoLine(adapt->getDescriptionOfPixel(xp, yp).c_str(), y > getTextHeight());
      }

      break;

    case button4:
      setInfoLine("");

      if (adapt != 0)
      {
        double s=adapt->getScale();
        double xx=(x+imx)/s;
        double yy=(y+imy)/s;

        s=1.0/pow(2.0, floor(log(1.0/s)/log(2.0)));

        if (s == adapt->getScale())
        {
          s*=2;
        }

        adapt->setScale(s);

        imx=static_cast<long>(xx*s-x);
        imy=static_cast<long>(yy*s-y);

        redrawImage();
        updateInfo();
      }

      break;

    case button5:
      if (adapt != 0)
      {
        double s=adapt->getScale();
        double xx=(x+imx)/s;
        double yy=(y+imy)/s;
        int    w, h;
        long   iw, ih;

        adapt->setScale(1.0);
        iw=adapt->getWidth();
        ih=adapt->getHeight();

        getSize(w, h);

        s=1.0/pow(2.0, floor(log(1.0/s)/log(2.0)+1e-6));

        s/=2;

        adapt->setScale(s);

        if (s < 1)
        {
          if (adapt->getWidth() < w && adapt->getHeight() < h)
          {
            s=static_cast<double>(w)/iw;
            adapt->setScale(s);

            if (adapt->getHeight() > h)
            {
              s=static_cast<double>(h)/ih;
              adapt->setScale(s);
            }
          }

          if (s > 1)
          {
            s=1;
            adapt->setScale(s);
          }
        }

        imx=static_cast<long>(xx*s-x);
        imy=static_cast<long>(yy*s-y);

        redrawImage();
        updateInfo();
      }

      break;

    default:
      break;
  }
}